

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O3

complex<double> zsign1(complex<double> z1,complex<double> z2)

{
  undefined8 in_RAX;
  complex<double> cVar1;
  
  cVar1._M_value._8_8_ = z2._M_value._0_8_;
  cVar1._M_value._0_8_ = in_RAX;
  return (complex<double>)cVar1._M_value;
}

Assistant:

complex <double> zsign1 ( complex <double> z1, complex <double> z2 )

//****************************************************************************80
//
//  Purpose:
//
//    ZSIGN1 is a complex <double> transfer-of-sign function.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    The L1 norm is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, complex <double> Z1, Z2, the arguments.
//
//    Output, complex <double> ZSIGN1,  a complex value, with the magnitude of
//    Z1, and the argument of Z2.
//
{
  complex <double> value;

  if ( zabs1 ( z2 ) == 0.0 )
  {
    value = complex <double> ( 0.0, 0.0 );
  }
  else
  {
    value = zabs1 ( z1 ) * ( z2 / zabs1 ( z2 ) );
  }

  return value;
}